

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

void libtorrent::anon_unknown_40::add_files_impl
               (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                *files,string *p,string *l,
               function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *pred,create_flags_t flags)

{
  undefined8 this;
  bool bVar1;
  char *in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  string_view lhs;
  string_view lhs_00;
  string_view rhs;
  string_view rhs_00;
  bool local_261;
  bool local_24b;
  uint64_t local_230;
  uint64_t local_228;
  int local_21c;
  undefined1 local_218 [8];
  string sym_path;
  uint local_1ec;
  uchar local_1e7;
  uchar local_1e6;
  bitfield_flag local_1e5;
  undefined4 local_1e4;
  uint local_1e0;
  uint local_1dc;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_1d5;
  undefined4 local_1d4;
  uint local_1d0;
  uint local_1cc;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_1c5;
  undefined4 local_1c4;
  uint local_1c0;
  uint local_1bc;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_1b6;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_1b5;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_1a5;
  uint local_1a4;
  file_flags_t file_flags;
  char *pcStack_1a0;
  string local_180;
  undefined1 local_160 [8];
  string leaf;
  directory i;
  uint local_108 [3];
  uint local_fc [3];
  uint local_f0;
  byte local_e9;
  uint local_e8;
  create_flags_t cStack_e4;
  bool recurse;
  uint local_e0;
  bitfield_flag<unsigned_int,_libtorrent::file_status_flag_tag,_void> local_dc;
  undefined1 local_d8 [8];
  file_status s;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  string f;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pred_local;
  string *l_local;
  string *p_local;
  vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *files_local
  ;
  create_flags_t flags_local;
  
  f.field_2._8_8_ = pred;
  local_60 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)p);
  local_70 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)l);
  lhs._M_str = local_70._0_8_;
  lhs._M_len = local_60._8_8_;
  rhs._M_str = in_R9;
  rhs._M_len = local_70._8_8_;
  combine_path_abi_cxx11_((string *)local_50,(libtorrent *)local_60._0_8_,lhs,rhs);
  this = f.field_2._8_8_;
  ::std::__cxx11::string::string((string *)&local_90,(string *)local_50);
  bVar1 = ::std::
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)this,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    boost::system::error_code::error_code((error_code *)&s.mode);
    file_status::file_status((file_status *)local_d8);
    local_e8 = 8;
    cStack_e4.m_val = flags.m_val;
    local_e0 = (uint)libtorrent::flags::operator&
                               (flags.m_val,
                                (bitfield_flag<unsigned_int,_libtorrent::create_flags_tag,_void>)8);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_e0);
    if (bVar1) {
      local_dc.m_val = 1;
    }
    else {
      libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_status_flag_tag,_void>::
      bitfield_flag(&local_dc);
    }
    stat_file((string *)local_50,(file_status *)local_d8,(error_code *)&s.mode,
              (file_status_flag_t)local_dc.m_val);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&s.mode);
    if (!bVar1) {
      local_fc[2] = s.ctime._0_4_;
      local_fc[1] = 1;
      local_f0 = (uint)libtorrent::flags::operator&
                                 (s.ctime._0_4_,
                                  (bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>
                                  )0x1);
      local_e9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_f0)
      ;
      local_108[2] = s.ctime._0_4_;
      local_108[1] = 8;
      local_fc[0] = (uint)libtorrent::flags::operator&
                                    (s.ctime._0_4_,
                                     (bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>
                                      )0x8);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_fc);
      local_24b = false;
      if (bVar1) {
        local_108[0] = (uint)libtorrent::flags::operator&
                                       (flags.m_val,
                                        (bitfield_flag<unsigned_int,_libtorrent::create_flags_tag,_void>
                                         )8);
        local_24b = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                              ((bitfield_flag *)local_108);
      }
      if (local_24b != false) {
        local_e9 = 0;
      }
      if ((local_e9 & 1) == 0) {
        local_1b4 = 0x100;
        local_1b0 = flags.m_val;
        local_1ac = (uint)libtorrent::flags::operator&
                                    (flags.m_val,
                                     (bitfield_flag<unsigned_int,_libtorrent::create_flags_tag,_void>
                                      )0x100);
        bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1ac)
        ;
        if (bVar1) {
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
          bitfield_flag(&local_1a5);
        }
        else {
          local_1c0 = s.ctime._0_4_;
          local_1c4 = 2;
          local_1bc = (uint)libtorrent::flags::operator&
                                      (s.ctime._0_4_,
                                       (bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>
                                        )0x2);
          bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)&local_1bc);
          if (bVar1) {
            local_1b6.m_val = '\x02';
          }
          else {
            libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
            bitfield_flag(&local_1b6);
          }
          local_1d0 = s.ctime._0_4_;
          local_1d4 = 4;
          local_1cc = (uint)libtorrent::flags::operator&
                                      (s.ctime._0_4_,
                                       (bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>
                                        )0x4);
          bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)&local_1cc);
          if (bVar1) {
            local_1c5.m_val = '\x04';
          }
          else {
            libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
            bitfield_flag(&local_1c5);
          }
          local_1b5 = libtorrent::flags::operator|(local_1b6,local_1c5);
          local_1e0 = s.ctime._0_4_;
          local_1e4 = 8;
          local_1dc = (uint)libtorrent::flags::operator&
                                      (s.ctime._0_4_,
                                       (bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>
                                        )0x8);
          bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)&local_1dc);
          if (bVar1) {
            local_1d5.m_val = '\b';
          }
          else {
            libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
            bitfield_flag(&local_1d5);
          }
          local_1a5 = libtorrent::flags::operator|(local_1b5,local_1d5);
        }
        local_1e6 = local_1a5.m_val;
        local_1e7 = '\b';
        local_1e5 = (bitfield_flag)
                    libtorrent::flags::operator&
                              (local_1a5,
                               (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b')
        ;
        bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1e5);
        local_261 = false;
        if (bVar1) {
          sym_path.field_2._12_4_ = 8;
          local_1ec = (uint)libtorrent::flags::operator&
                                      (flags.m_val,
                                       (bitfield_flag<unsigned_int,_libtorrent::create_flags_tag,_void>
                                        )8);
          local_261 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                                ((bitfield_flag *)&local_1ec);
        }
        if (local_261 == false) {
          local_230 = s.atime;
          ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>
          ::
          emplace_back<std::__cxx11::string,long&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>const&,long>
                    ((vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>
                      *)files,l,(long *)local_d8,&local_1a5,(long *)&local_230);
        }
        else {
          libtorrent::aux::get_symlink_path((string *)local_218,(string *)local_50);
          local_21c = 0;
          local_228 = s.atime;
          ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>
          ::
          emplace_back<std::__cxx11::string,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>const&,long,std::__cxx11::string>
                    ((vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>
                      *)files,l,&local_21c,&local_1a5,(long *)&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218)
          ;
          ::std::__cxx11::string::~string((string *)local_218);
        }
      }
      else {
        libtorrent::aux::directory::directory
                  ((directory *)((long)&leaf.field_2 + 8),(string *)local_50,(error_code *)&s.mode);
        while( true ) {
          bVar1 = libtorrent::aux::directory::done((directory *)((long)&leaf.field_2 + 8));
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          libtorrent::aux::directory::file_abi_cxx11_
                    ((string *)local_160,(directory *)((long)&leaf.field_2 + 8));
          bVar1 = ignore_subdir((string *)local_160);
          if (!bVar1) {
            auVar2 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)l);
            lhs_00._M_len = auVar2._8_8_;
            auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_160)
            ;
            pcStack_1a0 = auVar3._0_8_;
            lhs_00._M_str = pcStack_1a0;
            rhs_00._M_str = in_R9;
            rhs_00._M_len = auVar3._8_8_;
            combine_path_abi_cxx11_(&local_180,auVar2._0_8_,lhs_00,rhs_00);
            local_1a4 = flags.m_val;
            add_files_impl(files,p,&local_180,
                           (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)f.field_2._8_8_,flags);
            ::std::__cxx11::string::~string((string *)&local_180);
          }
          ::std::__cxx11::string::~string((string *)local_160);
          libtorrent::aux::directory::next
                    ((directory *)((long)&leaf.field_2 + 8),(error_code *)&s.mode);
        }
        libtorrent::aux::directory::~directory((directory *)((long)&leaf.field_2 + 8));
      }
    }
  }
  ::std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void add_files_impl(std::vector<create_file_entry>& files
		, std::string const& p
		, std::string l
		, std::function<bool(std::string)> const& pred
		, create_flags_t const flags)
	{
		std::string f = combine_path(p, l);
		if (!pred(f)) return;
		error_code ec;
		file_status s;
		stat_file(f, &s, ec, (flags & create_torrent::symlinks) ? dont_follow_links : file_status_flag_t{});
		if (ec) return;

		// recurse into directories
		bool recurse = bool(s.mode & file_status::directory);

		// if the file is not a link or we're following links, and it's a directory
		// only then should we recurse
		if ((s.mode & file_status::symlink) && (flags & create_torrent::symlinks))
			recurse = false;

		if (recurse)
		{
			for (aux::directory i(std::move(f), ec); !i.done(); i.next(ec))
			{
				std::string leaf = i.file();
				if (ignore_subdir(leaf)) continue;
				add_files_impl(files, p, combine_path(std::move(l), std::move(leaf)), pred, flags);
			}
		}
		else
		{
			file_flags_t const file_flags = (flags & create_torrent::no_attributes)
				? file_flags_t{}
				: ((s.mode & file_status::hidden) ? file_storage::flag_hidden : file_flags_t{})
					| ((s.mode & file_status::executable) ? file_storage::flag_executable : file_flags_t{})
					| ((s.mode & file_status::symlink) ? file_storage::flag_symlink : file_flags_t{})
					;

			// mask all bits to check if the file is a symlink
			if ((file_flags & file_storage::flag_symlink)
				&& (flags & create_torrent::symlinks))
			{
				std::string sym_path = aux::get_symlink_path(f);
				files.emplace_back(std::move(l), 0, file_flags, std::time_t(s.mtime)
					, std::move(sym_path));
			}
			else
			{
				files.emplace_back(std::move(l), s.file_size, file_flags, std::time_t(s.mtime));
			}
		}
	}